

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS ref_iso_boom_header(FILE **file_ptr,REF_INT ldim,char **scalar_names,char *filename)

{
  REF_STATUS RVar1;
  FILE *pFVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  pFVar2 = fopen(filename,"w");
  *file_ptr = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
  }
  if ((FILE *)*file_ptr == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x31c,
           "ref_iso_boom_header","unable to open file");
    RVar1 = 2;
  }
  else {
    fwrite("title=\"tecplot refine gather\"\n",0x1e,1,(FILE *)*file_ptr);
    fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,(FILE *)*file_ptr);
    if (scalar_names == (char **)0x0) {
      if (0 < ldim) {
        uVar3 = 1;
        do {
          fprintf((FILE *)*file_ptr," \"V%d\"",(ulong)uVar3);
          bVar5 = uVar3 != ldim;
          uVar3 = uVar3 + 1;
        } while (bVar5);
      }
    }
    else if (0 < ldim) {
      uVar4 = 0;
      do {
        fprintf((FILE *)*file_ptr," \"%s\"",scalar_names[uVar4]);
        uVar4 = uVar4 + 1;
      } while ((uint)ldim != uVar4);
    }
    fputc(10,(FILE *)*file_ptr);
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boom_header(FILE **file_ptr, REF_INT ldim,
                                       const char **scalar_names,
                                       const char *filename) {
  REF_INT i;
  *file_ptr = fopen(filename, "w");
  if (NULL == ((void *)*file_ptr)) printf("unable to open %s\n", filename);
  RNS(*file_ptr, "unable to open file");
  fprintf(*file_ptr, "title=\"tecplot refine gather\"\n");
  fprintf(*file_ptr, "variables = \"x\" \"y\" \"z\"");
  if (NULL != scalar_names) {
    for (i = 0; i < ldim; i++) fprintf(*file_ptr, " \"%s\"", scalar_names[i]);
  } else {
    for (i = 0; i < ldim; i++) fprintf(*file_ptr, " \"V%d\"", i + 1);
  }
  fprintf(*file_ptr, "\n");

  return REF_SUCCESS;
}